

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall spirv_cross::CompilerMSL::compile_abi_cxx11_(CompilerMSL *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  uint32_t uVar3;
  SPIREntryPoint *pSVar4;
  CompilerError *this_00;
  SPIRFunction *func;
  CompilerMSL *in_RSI;
  byte local_169;
  Bitset local_168;
  uint32_t *local_128;
  uint32_t *id_1;
  uint32_t *__end2;
  uint32_t *__begin2;
  uint32_t (*__range2) [8];
  TypedID<(spirv_cross::Types)2> local_100;
  uint32_t pass_count;
  TypedID<(spirv_cross::Types)2> local_f8;
  TypedID<(spirv_cross::Types)2> local_f4;
  TypedID<(spirv_cross::Types)2> local_f0;
  TypedID<(spirv_cross::Types)2> local_ec;
  TypedID<(spirv_cross::Types)2> local_e8;
  TypedID<(spirv_cross::Types)2> local_e4;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  local_e0;
  spirv_cross local_a8 [48];
  spirv_cross local_78 [8];
  string discard_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string builtin_helper_invocation;
  uint32_t *id;
  uint32_t *__end1;
  uint32_t *__begin1;
  uint32_t (*__range1) [8];
  CompilerMSL *this_local;
  
  replace_illegal_entry_point_names(in_RSI);
  ParsedIR::fixup_reserved_names(&(in_RSI->super_CompilerGLSL).super_Compiler.ir);
  (in_RSI->super_CompilerGLSL).options.vulkan_semantics = true;
  (in_RSI->super_CompilerGLSL).options.es = false;
  (in_RSI->super_CompilerGLSL).options.version = 0x1c2;
  ::std::__cxx11::string::operator=
            ((string *)&(in_RSI->super_CompilerGLSL).backend.null_pointer_literal,"nullptr");
  (in_RSI->super_CompilerGLSL).backend.float_literal_suffix = false;
  (in_RSI->super_CompilerGLSL).backend.uint32_t_literal_suffix = true;
  (in_RSI->super_CompilerGLSL).backend.int16_t_literal_suffix = "";
  (in_RSI->super_CompilerGLSL).backend.uint16_t_literal_suffix = "";
  (in_RSI->super_CompilerGLSL).backend.basic_int_type = "int";
  (in_RSI->super_CompilerGLSL).backend.basic_uint_type = "uint";
  (in_RSI->super_CompilerGLSL).backend.basic_int8_type = "char";
  (in_RSI->super_CompilerGLSL).backend.basic_uint8_type = "uchar";
  (in_RSI->super_CompilerGLSL).backend.basic_int16_type = "short";
  (in_RSI->super_CompilerGLSL).backend.basic_uint16_type = "ushort";
  (in_RSI->super_CompilerGLSL).backend.boolean_mix_function = "select";
  (in_RSI->super_CompilerGLSL).backend.swizzle_is_function = false;
  (in_RSI->super_CompilerGLSL).backend.shared_is_implied = false;
  (in_RSI->super_CompilerGLSL).backend.use_initializer_list = true;
  (in_RSI->super_CompilerGLSL).backend.use_typed_initializer_list = true;
  (in_RSI->super_CompilerGLSL).backend.native_row_major_matrix = false;
  (in_RSI->super_CompilerGLSL).backend.unsized_array_supported = false;
  (in_RSI->super_CompilerGLSL).backend.can_declare_arrays_inline = false;
  (in_RSI->super_CompilerGLSL).backend.allow_truncated_access_chain = true;
  (in_RSI->super_CompilerGLSL).backend.comparison_image_samples_scalar = true;
  (in_RSI->super_CompilerGLSL).backend.native_pointers = true;
  (in_RSI->super_CompilerGLSL).backend.nonuniform_qualifier = "";
  (in_RSI->super_CompilerGLSL).backend.support_small_type_sampling_result = true;
  (in_RSI->super_CompilerGLSL).backend.force_merged_mesh_block = false;
  (in_RSI->super_CompilerGLSL).backend.force_gl_in_out_block = false;
  (in_RSI->super_CompilerGLSL).backend.supports_empty_struct = true;
  (in_RSI->super_CompilerGLSL).backend.support_64bit_switch = true;
  (in_RSI->super_CompilerGLSL).backend.boolean_in_struct_remapped_type = Short;
  (in_RSI->super_CompilerGLSL).backend.can_return_array =
       (bool)(((in_RSI->msl_options).force_native_arrays ^ 0xffU) & 1);
  (in_RSI->super_CompilerGLSL).backend.array_is_value_type =
       (bool)(((in_RSI->msl_options).force_native_arrays ^ 0xffU) & 1);
  (in_RSI->super_CompilerGLSL).backend.array_is_value_type_in_buffer_blocks = false;
  (in_RSI->super_CompilerGLSL).backend.support_pointer_to_pointer = true;
  (in_RSI->super_CompilerGLSL).backend.implicit_c_integer_promotion_rules = true;
  in_RSI->capture_output_to_buffer = (bool)((in_RSI->msl_options).capture_output_to_buffer & 1);
  local_169 = 1;
  if (((in_RSI->msl_options).disable_rasterization & 1U) == 0) {
    local_169 = in_RSI->capture_output_to_buffer;
  }
  in_RSI->is_rasterization_disabled = (bool)(local_169 & 1);
  bVar1 = is_mesh_shader(in_RSI);
  if (bVar1) {
    pSVar4 = Compiler::get_entry_point((Compiler *)in_RSI);
    bVar1 = Bitset::get(&pSVar4->flags,0x1b);
    if (!bVar1) {
      (in_RSI->msl_options).enable_point_size_builtin = false;
    }
  }
  for (__end1 = in_RSI->next_metal_resource_ids; (VariableID *)__end1 != &in_RSI->stage_in_var_id;
      __end1 = __end1 + 1) {
    *__end1 = 0;
  }
  CompilerGLSL::fixup_anonymous_struct_names(&in_RSI->super_CompilerGLSL);
  CompilerGLSL::fixup_type_alias(&in_RSI->super_CompilerGLSL);
  (*(in_RSI->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3d])();
  EVar2 = Compiler::get_execution_model((Compiler *)in_RSI);
  if (EVar2 == ExecutionModelMeshEXT) {
    emit_mesh_entry_point(in_RSI);
  }
  sync_entry_point_aliases_and_names(in_RSI);
  Compiler::build_function_control_flow_graphs_and_analyze((Compiler *)in_RSI);
  Compiler::update_active_builtins((Compiler *)in_RSI);
  Compiler::analyze_image_and_sampler_usage((Compiler *)in_RSI);
  analyze_sampled_image_usage(in_RSI);
  Compiler::analyze_interlocked_resource_usage((Compiler *)in_RSI);
  analyze_workgroup_variables(in_RSI);
  preprocess_op_codes(in_RSI);
  build_implicit_builtins(in_RSI);
  bVar1 = needs_manual_helper_invocation_updates(in_RSI);
  if ((bVar1) && ((in_RSI->needs_helper_invocation & 1U) != 0)) {
    (*(in_RSI->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_58,in_RSI,0x17);
    join<std::__cxx11::string&,char_const(&)[28]>
              (local_78,local_58,(char (*) [28])" = true, discard_fragment()");
    if (((in_RSI->msl_options).force_fragment_with_side_effects_execution & 1U) != 0) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string&,char_const(&)[12]>
                (local_a8,(char (*) [2])0x420a9a,local_58,(char (*) [5])" ? (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [12])") : (void)0");
      ::std::__cxx11::string::operator=((string *)local_78,(string *)local_a8);
      ::std::__cxx11::string::~string((string *)local_a8);
    }
    ::std::__cxx11::string::operator=
              ((string *)&(in_RSI->super_CompilerGLSL).backend,(string *)local_78);
    ::std::__cxx11::string::operator=
              ((string *)&(in_RSI->super_CompilerGLSL).backend.demote_literal,(string *)local_78);
    ::std::__cxx11::string::~string((string *)local_78);
    ::std::__cxx11::string::~string((string *)local_58);
  }
  else {
    ::std::__cxx11::string::operator=
              ((string *)&(in_RSI->super_CompilerGLSL).backend,"discard_fragment()");
    ::std::__cxx11::string::operator=
              ((string *)&(in_RSI->super_CompilerGLSL).backend.demote_literal,"discard_fragment()");
  }
  CompilerGLSL::fixup_image_load_store_access(&in_RSI->super_CompilerGLSL);
  Compiler::get_active_interface_variables(&local_e0,(Compiler *)in_RSI);
  Compiler::set_enabled_interface_variables((Compiler *)in_RSI,&local_e0);
  ::std::
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  ::~unordered_set(&local_e0);
  if (((in_RSI->msl_options).force_active_argument_buffer_resources & 1U) != 0) {
    activate_argument_buffer_resources(in_RSI);
  }
  if (in_RSI->swizzle_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->swizzle_buffer_id);
  }
  if (in_RSI->buffer_size_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->buffer_size_buffer_id);
  }
  if (in_RSI->view_mask_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->view_mask_buffer_id);
  }
  if (in_RSI->dynamic_offsets_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->dynamic_offsets_buffer_id);
  }
  if (in_RSI->builtin_layer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->builtin_layer_id);
  }
  if ((in_RSI->builtin_dispatch_base_id != 0) &&
     (bVar1 = Options::supports_msl_version(&in_RSI->msl_options,1,2,0), !bVar1)) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->builtin_dispatch_base_id);
  }
  if (in_RSI->builtin_sample_mask_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->builtin_sample_mask_id);
  }
  if (in_RSI->builtin_frag_depth_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)in_RSI,in_RSI->builtin_frag_depth_id);
  }
  ::std::__cxx11::string::operator=((string *)&in_RSI->qual_pos_var_name,"");
  bVar1 = is_mesh_shader(in_RSI);
  if (bVar1) {
    EVar2 = Compiler::get_execution_model((Compiler *)in_RSI);
    CompilerGLSL::fixup_implicit_builtin_block_names(&in_RSI->super_CompilerGLSL,EVar2);
  }
  else {
    uVar3 = add_interface_block(in_RSI,StorageClassOutput,false);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_e4,uVar3);
    (in_RSI->stage_out_var_id).id = local_e4.id;
    uVar3 = add_interface_block(in_RSI,StorageClassOutput,true);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_e8,uVar3);
    (in_RSI->patch_stage_out_var_id).id = local_e8.id;
    uVar3 = add_interface_block(in_RSI,StorageClassInput,false);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_ec,uVar3);
    (in_RSI->stage_in_var_id).id = local_ec.id;
  }
  bVar1 = is_tese_shader(in_RSI);
  if (bVar1) {
    uVar3 = add_interface_block(in_RSI,StorageClassInput,true);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_f0,uVar3);
    (in_RSI->patch_stage_in_var_id).id = local_f0.id;
  }
  bVar1 = is_tesc_shader(in_RSI);
  if (bVar1) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&in_RSI->stage_out_var_id);
    uVar3 = add_interface_block_pointer(in_RSI,uVar3,StorageClassOutput);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_f4,uVar3);
    (in_RSI->stage_out_ptr_var_id).id = local_f4.id;
  }
  bVar1 = Compiler::is_tessellation_shader((Compiler *)in_RSI);
  if (bVar1) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&in_RSI->stage_in_var_id);
    uVar3 = add_interface_block_pointer(in_RSI,uVar3,StorageClassInput);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_f8,uVar3);
    (in_RSI->stage_in_ptr_var_id).id = local_f8.id;
  }
  bVar1 = is_mesh_shader(in_RSI);
  if (bVar1) {
    uVar3 = add_meshlet_block(in_RSI,false);
    TypedID<(spirv_cross::Types)2>::TypedID((TypedID<(spirv_cross::Types)2> *)&pass_count,uVar3);
    (in_RSI->mesh_out_per_vertex).id = pass_count;
    uVar3 = add_meshlet_block(in_RSI,true);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_100,uVar3);
    (in_RSI->mesh_out_per_primitive).id = local_100.id;
  }
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&in_RSI->stage_out_var_id);
  if (uVar3 == 0) {
    in_RSI->is_rasterization_disabled = true;
  }
  localize_global_variables(in_RSI);
  extract_global_variables_from_functions(in_RSI);
  mark_packable_structs(in_RSI);
  CompilerGLSL::reorder_type_alias(&in_RSI->super_CompilerGLSL);
  fix_up_shader_inputs_outputs(in_RSI);
  if (((in_RSI->msl_options).argument_buffers & 1U) != 0) {
    bVar1 = Options::supports_msl_version(&in_RSI->msl_options,2,0,0);
    if (!bVar1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Argument buffers can only be used with MSL 2.0 and up.")
      ;
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    analyze_argument_buffers(in_RSI);
  }
  __range2._4_4_ = 0;
  do {
    CompilerGLSL::reset(&in_RSI->super_CompilerGLSL,__range2._4_4_);
    in_RSI->next_metal_resource_index_buffer = 0;
    in_RSI->next_metal_resource_index_texture = 0;
    in_RSI->next_metal_resource_index_sampler = 0;
    id_1 = &(in_RSI->stage_in_var_id).id;
    __begin2 = in_RSI->next_metal_resource_ids;
    for (__end2 = __begin2; __end2 != id_1; __end2 = __end2 + 1) {
      local_128 = __end2;
      *__end2 = 0;
    }
    StringStream<4096UL,_4096UL>::reset(&(in_RSI->super_CompilerGLSL).buffer);
    (*(in_RSI->super_CompilerGLSL).super_Compiler._vptr_Compiler[0xe])();
    emit_custom_templates(in_RSI);
    emit_custom_functions(in_RSI);
    emit_specialization_constants_and_structs(in_RSI);
    emit_resources(in_RSI);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)
                       &(in_RSI->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
    func = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)in_RSI,uVar3);
    local_168.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_168.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_168.higher._M_h._M_element_count = 0;
    local_168.higher._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_168.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_168.higher._M_h._M_bucket_count = 0;
    local_168.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_168.lower = 0;
    local_168.higher._M_h._M_buckets = (__buckets_ptr)0x0;
    Bitset::Bitset(&local_168);
    CompilerGLSL::emit_function(&in_RSI->super_CompilerGLSL,func,&local_168);
    Bitset::~Bitset(&local_168);
    __range2._4_4_ = __range2._4_4_ + 1;
    bVar1 = Compiler::is_forcing_recompilation((Compiler *)in_RSI);
  } while (bVar1);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  return this;
}

Assistant:

string CompilerMSL::compile()
{
	replace_illegal_entry_point_names();
	ir.fixup_reserved_names();

	// Do not deal with GLES-isms like precision, older extensions and such.
	options.vulkan_semantics = true;
	options.es = false;
	options.version = 450;
	backend.null_pointer_literal = "nullptr";
	backend.float_literal_suffix = false;
	backend.uint32_t_literal_suffix = true;
	backend.int16_t_literal_suffix = "";
	backend.uint16_t_literal_suffix = "";
	backend.basic_int_type = "int";
	backend.basic_uint_type = "uint";
	backend.basic_int8_type = "char";
	backend.basic_uint8_type = "uchar";
	backend.basic_int16_type = "short";
	backend.basic_uint16_type = "ushort";
	backend.boolean_mix_function = "select";
	backend.swizzle_is_function = false;
	backend.shared_is_implied = false;
	backend.use_initializer_list = true;
	backend.use_typed_initializer_list = true;
	backend.native_row_major_matrix = false;
	backend.unsized_array_supported = false;
	backend.can_declare_arrays_inline = false;
	backend.allow_truncated_access_chain = true;
	backend.comparison_image_samples_scalar = true;
	backend.native_pointers = true;
	backend.nonuniform_qualifier = "";
	backend.support_small_type_sampling_result = true;
	backend.force_merged_mesh_block = false;
	backend.force_gl_in_out_block = false;
	backend.supports_empty_struct = true;
	backend.support_64bit_switch = true;
	backend.boolean_in_struct_remapped_type = SPIRType::Short;

	// Allow Metal to use the array<T> template unless we force it off.
	backend.can_return_array = !msl_options.force_native_arrays;
	backend.array_is_value_type = !msl_options.force_native_arrays;
	// Arrays which are part of buffer objects are never considered to be value types (just plain C-style).
	backend.array_is_value_type_in_buffer_blocks = false;
	backend.support_pointer_to_pointer = true;
	backend.implicit_c_integer_promotion_rules = true;

	capture_output_to_buffer = msl_options.capture_output_to_buffer;
	is_rasterization_disabled = msl_options.disable_rasterization || capture_output_to_buffer;

	if (is_mesh_shader() && !get_entry_point().flags.get(ExecutionModeOutputPoints))
		msl_options.enable_point_size_builtin = false;

	// Initialize array here rather than constructor, MSVC 2013 workaround.
	for (auto &id : next_metal_resource_ids)
		id = 0;

	fixup_anonymous_struct_names();
	fixup_type_alias();
	replace_illegal_names();
	if (get_execution_model() == ExecutionModelMeshEXT)
	{
		// Emit proxy entry-point for the sake of copy-pass
		emit_mesh_entry_point();
	}
	sync_entry_point_aliases_and_names();

	build_function_control_flow_graphs_and_analyze();
	update_active_builtins();
	analyze_image_and_sampler_usage();
	analyze_sampled_image_usage();
	analyze_interlocked_resource_usage();
	analyze_workgroup_variables();
	preprocess_op_codes();
	build_implicit_builtins();

	if (needs_manual_helper_invocation_updates() && needs_helper_invocation)
	{
		string builtin_helper_invocation = builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput);
		string discard_expr = join(builtin_helper_invocation, " = true, discard_fragment()");
		if (msl_options.force_fragment_with_side_effects_execution)
			discard_expr = join("!", builtin_helper_invocation, " ? (", discard_expr, ") : (void)0");
		backend.discard_literal = discard_expr;
		backend.demote_literal = discard_expr;
	}
	else
	{
		backend.discard_literal = "discard_fragment()";
		backend.demote_literal = "discard_fragment()";
	}

	fixup_image_load_store_access();

	set_enabled_interface_variables(get_active_interface_variables());
	if (msl_options.force_active_argument_buffer_resources)
		activate_argument_buffer_resources();

	if (swizzle_buffer_id)
		add_active_interface_variable(swizzle_buffer_id);
	if (buffer_size_buffer_id)
		add_active_interface_variable(buffer_size_buffer_id);
	if (view_mask_buffer_id)
		add_active_interface_variable(view_mask_buffer_id);
	if (dynamic_offsets_buffer_id)
		add_active_interface_variable(dynamic_offsets_buffer_id);
	if (builtin_layer_id)
		add_active_interface_variable(builtin_layer_id);
	if (builtin_dispatch_base_id && !msl_options.supports_msl_version(1, 2))
		add_active_interface_variable(builtin_dispatch_base_id);
	if (builtin_sample_mask_id)
		add_active_interface_variable(builtin_sample_mask_id);
	if (builtin_frag_depth_id)
		add_active_interface_variable(builtin_frag_depth_id);

	// Create structs to hold input, output and uniform variables.
	// Do output first to ensure out. is declared at top of entry function.
	qual_pos_var_name = "";
	if (is_mesh_shader())
	{
		fixup_implicit_builtin_block_names(get_execution_model());
	}
	else
	{
		stage_out_var_id = add_interface_block(StorageClassOutput);
		patch_stage_out_var_id = add_interface_block(StorageClassOutput, true);
		stage_in_var_id = add_interface_block(StorageClassInput);
	}

	if (is_tese_shader())
		patch_stage_in_var_id = add_interface_block(StorageClassInput, true);

	if (is_tesc_shader())
		stage_out_ptr_var_id = add_interface_block_pointer(stage_out_var_id, StorageClassOutput);
	if (is_tessellation_shader())
		stage_in_ptr_var_id = add_interface_block_pointer(stage_in_var_id, StorageClassInput);

	if (is_mesh_shader())
	{
		mesh_out_per_vertex = add_meshlet_block(false);
		mesh_out_per_primitive = add_meshlet_block(true);
	}

	// Metal vertex functions that define no output must disable rasterization and return void.
	if (!stage_out_var_id)
		is_rasterization_disabled = true;

	// Convert the use of global variables to recursively-passed function parameters
	localize_global_variables();
	extract_global_variables_from_functions();

	// Mark any non-stage-in structs to be tightly packed.
	mark_packable_structs();
	reorder_type_alias();

	// Add fixup hooks required by shader inputs and outputs. This needs to happen before
	// the loop, so the hooks aren't added multiple times.
	fix_up_shader_inputs_outputs();

	// If we are using argument buffers, we create argument buffer structures for them here.
	// These buffers will be used in the entry point, not the individual resources.
	if (msl_options.argument_buffers)
	{
		if (!msl_options.supports_msl_version(2, 0))
			SPIRV_CROSS_THROW("Argument buffers can only be used with MSL 2.0 and up.");
		analyze_argument_buffers();
	}

	uint32_t pass_count = 0;
	do
	{
		reset(pass_count);

		// Start bindings at zero.
		next_metal_resource_index_buffer = 0;
		next_metal_resource_index_texture = 0;
		next_metal_resource_index_sampler = 0;
		for (auto &id : next_metal_resource_ids)
			id = 0;

		// Move constructor for this type is broken on GCC 4.9 ...
		buffer.reset();

		emit_header();
		emit_custom_templates();
		emit_custom_functions();
		emit_specialization_constants_and_structs();
		emit_resources();
		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	return buffer.str();
}